

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * stripPostfix(string *__return_storage_ptr__,string *value,string *postfix)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  __sv_type __x;
  string *postfix_local;
  string *value_local;
  string *strippedValue;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,value);
  __x = std::__cxx11::string::operator_cast_to_basic_string_view((string *)postfix);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                    (__return_storage_ptr__,__x);
  if (bVar1) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (__return_storage_ptr__);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (postfix);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,sVar2 - sVar3,0xffffffffffffffff);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string stripPostfix( std::string const & value, std::string const & postfix )
{
  std::string strippedValue = value;
  if ( strippedValue.ends_with( postfix ) )
  {
    strippedValue.erase( strippedValue.length() - postfix.length() );
  }
  return strippedValue;
}